

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generation.cpp
# Opt level: O2

bool __thiscall Generation::wasUpdated(Generation *this)

{
  bool bVar1;
  bool bVar2;
  MutexLocker lock;
  unsigned_long onDisk;
  File genFile;
  string local_58;
  string local_38;
  
  if (this->isToken == true) {
    MutexLocker::MutexLocker(&lock,this->genMutex);
    std::__cxx11::string::string((string *)&local_58,(string *)&this->path);
    File::File(&genFile,&local_58,this->umask,true,false,false,true);
    std::__cxx11::string::~string((string *)&local_58);
    bVar1 = File::isValid(&genFile);
    bVar2 = true;
    if (bVar1) {
      File::lock(&genFile,true);
      bVar1 = File::readULong(&genFile,&onDisk);
      bVar2 = true;
      if (bVar1) {
        if (onDisk == this->currentValue) {
          bVar2 = false;
        }
        else {
          this->currentValue = onDisk;
        }
      }
    }
    File::~File(&genFile);
    MutexLocker::~MutexLocker(&lock);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,(string *)&this->path);
    File::File(&genFile,&local_38,this->umask,true,false,false,true);
    std::__cxx11::string::~string((string *)&local_38);
    bVar1 = File::isValid(&genFile);
    bVar2 = true;
    if (bVar1) {
      File::lock(&genFile,true);
      bVar1 = File::readULong(&genFile,(unsigned_long *)&lock);
      bVar2 = !bVar1 || lock._vptr_MutexLocker != (_func_int **)this->currentValue;
    }
    File::~File(&genFile);
  }
  return bVar2;
}

Assistant:

bool Generation::wasUpdated()
{
	if (isToken)
	{
		MutexLocker lock(genMutex);

		File genFile(path, umask);

		if (!genFile.isValid())
		{
			return true;
		}

		genFile.lock();

		unsigned long onDisk;

		if (!genFile.readULong(onDisk))
		{
			return true;
		}

		if (onDisk != currentValue)
		{
			currentValue = onDisk;
			return true;
		}

		return false;
	}
	else
	{
		File objectFile(path, umask);

		if (!objectFile.isValid())
		{
			return true;
		}

		objectFile.lock();

		unsigned long onDisk;

		if (!objectFile.readULong(onDisk))
		{
			return true;
		}

		return (onDisk != currentValue);
	}
}